

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_id.cc
# Opt level: O3

ID * ID::NewAnonymousID(string *prefix)

{
  ID *this;
  string local_30;
  
  this = (ID *)operator_new(0x78);
  anonymous_id_seq = anonymous_id_seq + 1;
  strfmt_abi_cxx11_(&local_30,"%s%03d",(prefix->_M_dataplus)._M_p);
  ID(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  this->anonymous_id_ = true;
  return this;
}

Assistant:

ID* ID::NewAnonymousID(const string& prefix)
	{
	ID* id = new ID(strfmt("%s%03d", prefix.c_str(), ++anonymous_id_seq));
	id->anonymous_id_ = true;
	return id;
	}